

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::IsClosed(ON_RevSurface *this,int dir)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  
  uVar1 = (uint)(dir == 0);
  if (this->m_bTransposed == false) {
    uVar1 = dir;
  }
  if (uVar1 == 1) {
    if (this->m_curve != (ON_Curve *)0x0) {
      iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      return SUB41(iVar2,0);
    }
  }
  else if (uVar1 == 0) {
    dVar3 = ON_Interval::Length(&this->m_angle);
    if (6.283185306946756 <= dVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_RevSurface::IsClosed( int dir ) const  // dir  0 = "s", 1 = "t"
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    if (m_angle.Length() >= 2.0*ON_PI-ON_ZERO_TOLERANCE )
      rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->IsClosed();
  }
  return rc;
}